

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O3

int get_layer_weights(Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights)

{
  string *psVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  ConvolutionDepthWise *convolutiondepthwise;
  value_type *__x;
  
  psVar1 = &layer->type;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
              (weights,(value_type *)
                       &layer[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    iVar2 = extraout_EAX_00;
    if (*(int *)&layer[1].type._M_dataplus._M_p != 0) {
      __x = (value_type *)&layer[2].one_blob_only;
LAB_00141c81:
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back(weights,__x);
      return extraout_EAX_02;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                (weights,(value_type *)
                         &layer[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      iVar2 = extraout_EAX_01;
      if (*(int *)&layer[1].type._M_dataplus._M_p != 0) {
        __x = (value_type *)&layer[2].support_tensor_storage;
        goto LAB_00141c81;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                  (weights,(value_type *)&layer[1].name.field_2);
        iVar2 = extraout_EAX;
        if (*(int *)((long)&layer[1]._vptr_Layer + 4) != 0) {
          __x = (value_type *)
                &layer[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00141c81;
        }
      }
      else {
        get_layer_weights();
        iVar2 = extraout_EAX_03;
      }
    }
  }
  return iVar2;
}

Assistant:

static int get_layer_weights(const ncnn::Layer* layer, std::vector<ncnn::Mat>& weights)
{
    if (layer->type == "Convolution")
    {
        ncnn::Convolution* convolution = (ncnn::Convolution*)layer;
        weights.push_back(convolution->weight_data);
        if (convolution->bias_term)
            weights.push_back(convolution->bias_data);
    }
    else if (layer->type == "ConvolutionDepthWise")
    {
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layer;
        weights.push_back(convolutiondepthwise->weight_data);
        if (convolutiondepthwise->bias_term)
            weights.push_back(convolutiondepthwise->bias_data);
    }
    else if (layer->type == "InnerProduct")
    {
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layer;
        weights.push_back(innerproduct->weight_data);
        if (innerproduct->bias_term)
            weights.push_back(innerproduct->bias_data);
    }
    else
    {
        fprintf(stderr, "unexpected layer type %s in get_layer_weights\n", layer->type.c_str());
        return -1;
    }

    return 0;
}